

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proitems.h
# Opt level: O3

ProString * __thiscall
ProStringRwUser::extract(ProString *__return_storage_ptr__,ProStringRwUser *this,QString *s)

{
  Data *pDVar1;
  long in_FS_OFFSET;
  ProString local_50;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar1 = (s->d).d;
  if ((pDVar1 == (Data *)0x0) || (pDVar1 != (((this->super_ProStringRoUser).m_rs)->d).d)) {
    ProString::ProString(&local_50,s);
    local_50.m_file = this->m_ps->m_file;
    ProString::ProString(__return_storage_ptr__,&local_50);
    if (&(local_50.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_50.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_50.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((local_50.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
          0) {
        QArrayData::deallocate(&(local_50.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (*(long *)(in_FS_OFFSET + 0x28) != local_20) goto LAB_0026e6f3;
  }
  else {
    if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
LAB_0026e6f3:
      __stack_chk_fail();
    }
    ProString::ProString(__return_storage_ptr__,this->m_ps);
  }
  return __return_storage_ptr__;
}

Assistant:

ProString extract(const QString &s) const
        { return s.isSharedWith(*m_rs) ? *m_ps : ProString(s).setSource(*m_ps); }